

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::
     SerReadWriteMany<ParamsStream<AutoFile&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
               (ParamsStream<AutoFile_&,_CAddress::SerParams> *s,CAddress *args,CNetAddr *args_1,
               Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
               *args_2,int *args_3)

{
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *ptVar1;
  Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
  *__nbytes;
  long in_FS_OFFSET;
  uint64_t obj;
  int local_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  CAddress::SerializationOps<ParamsStream<AutoFile&,CAddress::SerParams>,CAddress,ActionUnserialize>
            (args,s);
  CNetAddr::Unserialize<ParamsStream<AutoFile&,CAddress::SerParams>>(args_1,s);
  ptVar1 = args_2->m_object;
  AutoFile::read(s->m_substream,(int)&local_30,&DAT_00000008,(size_t)__nbytes);
  (ptVar1->__d).__r = CONCAT44(uStack_2c,local_30);
  AutoFile::read(s->m_substream,(int)&local_30,(void *)0x4,(size_t)__nbytes);
  *args_3 = local_30;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }